

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O2

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool bVar2;
  undefined7 extraout_var;
  long lVar3;
  ulong uVar4;
  cmState *this_00;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  allocator local_b6;
  allocator local_b5;
  undefined4 local_b4;
  ulong local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  char *local_a0;
  cmCommand *local_98;
  string variable;
  string local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = args;
  local_98 = &this->super_cmCommand;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __lhs) {
    std::__cxx11::string::string
              ((string *)&variable,"called with incorrect number of arguments",
               (allocator *)&local_70);
    cmCommand::SetError(local_98,&variable);
    std::__cxx11::string::~string((string *)&variable);
    local_b4 = 0;
    goto LAB_002a5cde;
  }
  bVar2 = std::operator==(__lhs,"CLEAR");
  if (bVar2) {
LAB_002a5b06:
    bVar2 = std::operator==((local_a8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"CLEAR");
    local_a0 = "1";
    if (bVar2) {
      local_a0 = "0";
    }
    local_b0 = CONCAT71(extraout_var,1);
    uVar7 = 1;
  }
  else {
    bVar2 = std::operator==((local_a8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"FORCE");
    if (bVar2) goto LAB_002a5b06;
    local_a0 = "1";
    uVar7 = 0;
    local_b0 = 0;
  }
  do {
    pbVar1 = (local_a8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(local_a8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    uVar4 = lVar3 >> 5;
    local_b4 = (undefined4)CONCAT71((int7)(lVar3 >> 0xd),uVar4 <= uVar7);
    if (uVar4 <= uVar7) break;
    std::__cxx11::string::string((string *)&variable,(string *)(pbVar1 + uVar7));
    this_00 = cmMakefile::GetState(((cmCommand *)&local_98->super_cmObject)->Makefile);
    pcVar5 = cmState::GetCacheEntryValue(this_00,&variable);
    if (pcVar5 == (char *)0x0) {
      local_b0 = 1;
      cmState::AddCacheEntry(this_00,&variable,(char *)0x0,(char *)0x0,UNINITIALIZED);
    }
    pcVar5 = cmState::GetCacheEntryValue(this_00,&variable);
    if (pcVar5 == (char *)0x0) {
      cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,"ADVANCED",(allocator *)&local_50);
      pcVar6 = cmState::GetCacheEntryProperty(this_00,&variable,&local_70);
      uVar4 = local_b0;
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar6 == (char *)0x0 || (uVar4 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_70,"ADVANCED",&local_b5);
        std::__cxx11::string::string((string *)&local_50,local_a0,&local_b6);
        cmState::SetCacheEntryProperty(this_00,&variable,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::~string((string *)&variable);
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (pcVar5 != (char *)0x0);
LAB_002a5cde:
  return SUB41(local_b4,0);
}

Assistant:

bool cmMarkAsAdvancedCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  unsigned int i =0;
  const char* value = "1";
  bool overwrite = false;
  if(args[0] == "CLEAR" || args[0] == "FORCE")
    {
    overwrite = true;
    if(args[0] == "CLEAR")
      {
      value = "0";
      }
    i = 1;
    }
  for(; i < args.size(); ++i)
    {
    std::string variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable))
      {
      state->AddCacheEntry(variable, 0, 0, cmState::UNINITIALIZED);
      overwrite = true;
      }
    if (!state->GetCacheEntryValue(variable))
      {
      cmSystemTools::Error("This should never happen...");
      return false;
      }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite)
      {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
      }
    }
  return true;
}